

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O3

void fy_emit_write_indent(fy_emitter *emit,int indent)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int len;
  size_t __n;
  char *str;
  undefined8 uStack_30;
  char acStack_28 [8];
  
  iVar3 = 0;
  if (0 < indent) {
    iVar3 = indent;
  }
  if ((((emit->flags & 2) == 0) || (iVar2 = emit->column, iVar3 < iVar2)) ||
     ((emit->flags & 1) == 0 && iVar2 == iVar3)) {
    uStack_30 = 0x1253fc;
    fy_emit_putc(emit,fyewt_linebreak,10);
    iVar2 = emit->column;
  }
  len = iVar3 - iVar2;
  if (len != 0 && iVar2 <= iVar3) {
    __n = (size_t)len;
    lVar1 = -(__n + 0x10 & 0xfffffffffffffff0);
    str = acStack_28 + lVar1;
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x125428;
    memset(str,0x20,__n);
    str[__n] = '\0';
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x125440;
    fy_emit_write(emit,fyewt_indent,str,len);
  }
  *(byte *)&emit->flags = (byte)emit->flags | 3;
  return;
}

Assistant:

void fy_emit_write_indent(struct fy_emitter *emit, int indent) {
    int len;
    char *ws;

    indent = indent > 0 ? indent : 0;

    if (!fy_emit_indentation(emit) || emit->column > indent ||
        (emit->column == indent && !fy_emit_whitespace(emit)))
        fy_emit_putc(emit, fyewt_linebreak, '\n');

    if (emit->column < indent) {
        len = indent - emit->column;
        ws = alloca(len + 1);
        memset(ws, ' ', len);
        ws[len] = '\0';
        fy_emit_write(emit, fyewt_indent, ws, len);
    }

    emit->flags |= FYEF_WHITESPACE | FYEF_INDENTATION;
}